

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
format_handler<custom_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_text(format_handler<custom_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *this,char *begin,char *end)

{
  type __dest;
  ptrdiff_t _Num;
  iterator out;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> local_20;
  
  local_20.container =
       (this->context).
       super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
       .out_.container;
  __dest = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                     (&local_20,(long)end - (long)begin);
  if ((long)end - (long)begin != 0) {
    memmove(__dest,begin,(long)end - (long)begin);
  }
  (this->context).
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  .out_.container = local_20.container;
  return;
}

Assistant:

void on_text(const Char *begin, const Char *end) {
    auto size = internal::to_unsigned(end - begin);
    auto out = context.out();
    auto &&it = internal::reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }